

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O3

void av1_resize_horz_dir_avx2
               (uint8_t *input,int in_stride,uint8_t *intbuf,int height,int filtered_length,
               int width2)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 (*pauVar10) [16];
  int row_offset;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar21 [32];
  undefined1 auVar28 [32];
  
  if (filtered_length < 0x20) {
    av1_resize_horz_dir_sse2(input,in_stride,intbuf,height,filtered_length,width2);
    return;
  }
  if ((filtered_length & 0x1fU) == 0) {
    if (0 < height) {
      iVar3 = in_stride * 2;
      uVar16 = (ulong)(uint)filtered_length - 0x20;
      iVar9 = 0;
      auVar31._16_16_ = _DAT_0056ada0;
      auVar31._0_16_ = _DAT_0056ada0;
      auVar20._8_2_ = 0xfdff;
      auVar20._0_8_ = 0xfdfffdfffdfffdff;
      auVar20._10_2_ = 0xfdff;
      auVar20._12_2_ = 0xfdff;
      auVar20._14_2_ = 0xfdff;
      auVar20._16_2_ = 0xfdff;
      auVar20._18_2_ = 0xfdff;
      auVar20._20_2_ = 0xfdff;
      auVar20._22_2_ = 0xfdff;
      auVar20._24_2_ = 0xfdff;
      auVar20._26_2_ = 0xfdff;
      auVar20._28_2_ = 0xfdff;
      auVar20._30_2_ = 0xfdff;
      auVar25._8_2_ = 0x380c;
      auVar25._0_8_ = 0x380c380c380c380c;
      auVar25._10_2_ = 0x380c;
      auVar25._12_2_ = 0x380c;
      auVar25._14_2_ = 0x380c;
      auVar25._16_2_ = 0x380c;
      auVar25._18_2_ = 0x380c;
      auVar25._20_2_ = 0x380c;
      auVar25._22_2_ = 0x380c;
      auVar25._24_2_ = 0x380c;
      auVar25._26_2_ = 0x380c;
      auVar25._28_2_ = 0x380c;
      auVar25._30_2_ = 0x380c;
      auVar29._8_2_ = 0xc38;
      auVar29._0_8_ = 0xc380c380c380c38;
      auVar29._10_2_ = 0xc38;
      auVar29._12_2_ = 0xc38;
      auVar29._14_2_ = 0xc38;
      auVar29._16_2_ = 0xc38;
      auVar29._18_2_ = 0xc38;
      auVar29._20_2_ = 0xc38;
      auVar29._22_2_ = 0xc38;
      auVar29._24_2_ = 0xc38;
      auVar29._26_2_ = 0xc38;
      auVar29._28_2_ = 0xc38;
      auVar29._30_2_ = 0xc38;
      auVar33._8_2_ = 0xfffd;
      auVar33._0_8_ = 0xfffdfffdfffdfffd;
      auVar33._10_2_ = 0xfffd;
      auVar33._12_2_ = 0xfffd;
      auVar33._14_2_ = 0xfffd;
      auVar33._16_2_ = 0xfffd;
      auVar33._18_2_ = 0xfffd;
      auVar33._20_2_ = 0xfffd;
      auVar33._22_2_ = 0xfffd;
      auVar33._24_2_ = 0xfffd;
      auVar33._26_2_ = 0xfffd;
      auVar33._28_2_ = 0xfffd;
      auVar33._30_2_ = 0xfffd;
      auVar34._16_16_ = _DAT_0056adb0;
      auVar34._0_16_ = _DAT_0056adb0;
      auVar35._8_4_ = 0x40;
      auVar35._0_8_ = 0x4000000040;
      auVar35._12_4_ = 0x40;
      auVar35._16_4_ = 0x40;
      auVar35._20_4_ = 0x40;
      auVar35._24_4_ = 0x40;
      auVar35._28_4_ = 0x40;
      uVar14 = 0;
      do {
        uVar18 = 0;
        iVar6 = 0;
        iVar4 = 0;
        pauVar10 = (undefined1 (*) [16])intbuf;
        do {
          iVar11 = (int)uVar18;
          auVar36 = vperm2i128_avx2(*(undefined1 (*) [32])(input + (iVar9 + iVar11 + iVar6)),
                                    *(undefined1 (*) [32])(input + (in_stride + iVar11 + iVar6)),
                                    0x20);
          auVar44 = vperm2i128_avx2(*(undefined1 (*) [32])(input + (iVar9 + iVar11 + iVar6)),
                                    *(undefined1 (*) [32])(input + (in_stride + iVar11 + iVar6)),
                                    0x31);
          if (uVar18 == 0) {
            auVar44 = vpalignr_avx2(auVar44,auVar36,0xd);
            auVar36 = vpshufb_avx2(auVar36,auVar31);
          }
          if (uVar16 == uVar18) {
            iVar4 = 5;
          }
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(input + (((in_stride + iVar11) - iVar4) + 0x1d));
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(input + (((iVar9 + iVar11) - iVar4) + 0x1d));
          auVar38._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar39;
          auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar42;
          if (uVar16 == uVar18) {
            auVar38 = vpshufb_avx2(auVar38,auVar34);
          }
          uVar18 = uVar18 + 0x20;
          auVar41 = vpalignr_avx2(auVar44,auVar36,2);
          auVar28 = vpalignr_avx2(auVar44,auVar36,4);
          auVar32 = vpalignr_avx2(auVar44,auVar36,6);
          auVar37 = vpalignr_avx2(auVar38,auVar44,2);
          auVar40 = vpalignr_avx2(auVar38,auVar44,4);
          auVar43 = vpalignr_avx2(auVar38,auVar44,6);
          auVar36 = vpmaddubsw_avx2(auVar36,auVar20);
          auVar38 = vpmaddubsw_avx2(auVar41,auVar25);
          auVar36 = vpaddw_avx2(auVar38,auVar36);
          auVar38 = vpmaddubsw_avx2(auVar28,auVar29);
          auVar41 = vpmaddubsw_avx2(auVar32,auVar33);
          auVar38 = vpaddw_avx2(auVar41,auVar38);
          auVar41 = vpmovsxwd_avx2(auVar36._0_16_);
          auVar36 = vpmovsxwd_avx2(auVar36._16_16_);
          auVar28 = vpmovsxwd_avx2(auVar38._0_16_);
          auVar41 = vpaddd_avx2(auVar41,auVar28);
          auVar38 = vpmovsxwd_avx2(auVar38._16_16_);
          auVar38 = vpaddd_avx2(auVar36,auVar38);
          auVar44 = vpmaddubsw_avx2(auVar44,auVar20);
          auVar36 = vpmaddubsw_avx2(auVar37,auVar25);
          auVar44 = vpaddw_avx2(auVar36,auVar44);
          auVar36 = vpmaddubsw_avx2(auVar40,auVar29);
          auVar28 = vpmaddubsw_avx2(auVar43,auVar33);
          auVar36 = vpaddw_avx2(auVar28,auVar36);
          auVar28 = vpmovsxwd_avx2(auVar44._0_16_);
          auVar32 = vpmovsxwd_avx2(auVar44._16_16_);
          auVar44 = vpmovsxwd_avx2(auVar36._0_16_);
          auVar44 = vpaddd_avx2(auVar28,auVar44);
          auVar36 = vpmovsxwd_avx2(auVar36._16_16_);
          auVar36 = vpaddd_avx2(auVar36,auVar32);
          auVar41 = vpaddd_avx2(auVar41,auVar35);
          auVar41 = vpsrad_avx2(auVar41,7);
          auVar44 = vpaddd_avx2(auVar44,auVar35);
          auVar44 = vpsrad_avx2(auVar44,7);
          auVar44 = vpackusdw_avx2(auVar41,auVar44);
          auVar38 = vpaddd_avx2(auVar38,auVar35);
          auVar38 = vpsrad_avx2(auVar38,7);
          auVar36 = vpaddd_avx2(auVar36,auVar35);
          auVar36 = vpsrad_avx2(auVar36,7);
          auVar36 = vpackusdw_avx2(auVar38,auVar36);
          auVar44 = vpackuswb_avx2(auVar44,auVar36);
          auVar39 = vpunpckldq_avx(auVar44._0_16_,auVar44._16_16_);
          *pauVar10 = auVar39;
          auVar39 = vpunpckhdq_avx(auVar44._0_16_,auVar44._16_16_);
          *(undefined1 (*) [16])(*pauVar10 + width2) = auVar39;
          pauVar10 = pauVar10 + 1;
          iVar6 = -3;
        } while (uVar18 < (uint)filtered_length);
        uVar14 = uVar14 + 2;
        in_stride = in_stride + iVar3;
        iVar9 = iVar9 + iVar3;
        intbuf = *(undefined1 (*) [16])intbuf + (long)width2 * 2;
      } while (uVar14 < (uint)height);
    }
  }
  else if (0 < height) {
    lVar5 = (long)width2;
    iVar9 = 0;
    auVar44._16_16_ = _DAT_0056ada0;
    auVar44._0_16_ = _DAT_0056ada0;
    auVar36._16_16_ = _DAT_0056adb0;
    auVar36._0_16_ = _DAT_0056adb0;
    auVar41._8_4_ = 0x40;
    auVar41._0_8_ = 0x4000000040;
    auVar41._12_4_ = 0x40;
    auVar41._16_4_ = 0x40;
    auVar41._20_4_ = 0x40;
    auVar41._24_4_ = 0x40;
    auVar41._28_4_ = 0x40;
    uVar16 = 0;
    iVar3 = in_stride;
    do {
      lVar17 = uVar16 * lVar5;
      bVar15 = true;
      lVar12 = 0;
      uVar14 = 0;
      iVar8 = 0;
      iVar11 = 0;
      iVar6 = 0;
      iVar4 = filtered_length;
      do {
        iVar13 = (int)uVar16;
        if ((iVar4 == 0x22) || (iVar4 == 0x24)) goto LAB_00466ef1;
        iVar11 = (int)uVar14;
        auVar20 = vperm2i128_avx2(*(undefined1 (*) [32])(input + (iVar9 + iVar11 + iVar8)),
                                  *(undefined1 (*) [32])(input + (iVar3 + iVar11 + iVar8)),0x20);
        auVar31 = vperm2i128_avx2(*(undefined1 (*) [32])(input + (iVar9 + iVar11 + iVar8)),
                                  *(undefined1 (*) [32])(input + (iVar3 + iVar11 + iVar8)),0x31);
        if (uVar14 == 0) {
          auVar31 = vpalignr_avx2(auVar31,auVar20,0xd);
          auVar20 = vpshufb_avx2(auVar20,auVar44);
        }
        if ((0x20 - (ulong)(uint)filtered_length) + uVar14 == 0) {
          iVar6 = 5;
        }
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(input + (((iVar3 + iVar11) - iVar6) + 0x1d));
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(input + (((iVar9 + iVar11) - iVar6) + 0x1d));
        auVar28._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar27;
        auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
        if ((0x20 - (ulong)(uint)filtered_length) + uVar14 == 0) {
          auVar28 = vpshufb_avx2(auVar28,auVar36);
        }
        uVar14 = uVar14 + 0x20;
        auVar25 = vpalignr_avx2(auVar31,auVar20,2);
        auVar29 = vpalignr_avx2(auVar31,auVar20,4);
        auVar33 = vpalignr_avx2(auVar31,auVar20,6);
        auVar34 = vpalignr_avx2(auVar28,auVar31,2);
        auVar35 = vpalignr_avx2(auVar28,auVar31,4);
        auVar38 = vpalignr_avx2(auVar28,auVar31,6);
        auVar37._8_2_ = 0xfdff;
        auVar37._0_8_ = 0xfdfffdfffdfffdff;
        auVar37._10_2_ = 0xfdff;
        auVar37._12_2_ = 0xfdff;
        auVar37._14_2_ = 0xfdff;
        auVar37._16_2_ = 0xfdff;
        auVar37._18_2_ = 0xfdff;
        auVar37._20_2_ = 0xfdff;
        auVar37._22_2_ = 0xfdff;
        auVar37._24_2_ = 0xfdff;
        auVar37._26_2_ = 0xfdff;
        auVar37._28_2_ = 0xfdff;
        auVar37._30_2_ = 0xfdff;
        auVar40._8_2_ = 0x380c;
        auVar40._0_8_ = 0x380c380c380c380c;
        auVar40._10_2_ = 0x380c;
        auVar40._12_2_ = 0x380c;
        auVar40._14_2_ = 0x380c;
        auVar40._16_2_ = 0x380c;
        auVar40._18_2_ = 0x380c;
        auVar40._20_2_ = 0x380c;
        auVar40._22_2_ = 0x380c;
        auVar40._24_2_ = 0x380c;
        auVar40._26_2_ = 0x380c;
        auVar40._28_2_ = 0x380c;
        auVar40._30_2_ = 0x380c;
        auVar20 = vpmaddubsw_avx2(auVar20,auVar37);
        auVar25 = vpmaddubsw_avx2(auVar25,auVar40);
        auVar43._8_2_ = 0xc38;
        auVar43._0_8_ = 0xc380c380c380c38;
        auVar43._10_2_ = 0xc38;
        auVar43._12_2_ = 0xc38;
        auVar43._14_2_ = 0xc38;
        auVar43._16_2_ = 0xc38;
        auVar43._18_2_ = 0xc38;
        auVar43._20_2_ = 0xc38;
        auVar43._22_2_ = 0xc38;
        auVar43._24_2_ = 0xc38;
        auVar43._26_2_ = 0xc38;
        auVar43._28_2_ = 0xc38;
        auVar43._30_2_ = 0xc38;
        auVar20 = vpaddw_avx2(auVar25,auVar20);
        auVar25 = vpmaddubsw_avx2(auVar29,auVar43);
        auVar32._8_2_ = 0xfffd;
        auVar32._0_8_ = 0xfffdfffdfffdfffd;
        auVar32._10_2_ = 0xfffd;
        auVar32._12_2_ = 0xfffd;
        auVar32._14_2_ = 0xfffd;
        auVar32._16_2_ = 0xfffd;
        auVar32._18_2_ = 0xfffd;
        auVar32._20_2_ = 0xfffd;
        auVar32._22_2_ = 0xfffd;
        auVar32._24_2_ = 0xfffd;
        auVar32._26_2_ = 0xfffd;
        auVar32._28_2_ = 0xfffd;
        auVar32._30_2_ = 0xfffd;
        auVar29 = vpmaddubsw_avx2(auVar33,auVar32);
        auVar25 = vpaddw_avx2(auVar29,auVar25);
        auVar29 = vpmovsxwd_avx2(auVar20._0_16_);
        auVar20 = vpmovsxwd_avx2(auVar20._16_16_);
        auVar33 = vpmovsxwd_avx2(auVar25._0_16_);
        auVar29 = vpaddd_avx2(auVar33,auVar29);
        auVar25 = vpmovsxwd_avx2(auVar25._16_16_);
        auVar25 = vpaddd_avx2(auVar20,auVar25);
        auVar31 = vpmaddubsw_avx2(auVar31,auVar37);
        auVar20 = vpmaddubsw_avx2(auVar34,auVar40);
        auVar31 = vpaddw_avx2(auVar20,auVar31);
        auVar20 = vpmaddubsw_avx2(auVar35,auVar43);
        auVar33 = vpmaddubsw_avx2(auVar38,auVar32);
        auVar20 = vpaddw_avx2(auVar33,auVar20);
        auVar33 = vpmovsxwd_avx2(auVar31._0_16_);
        auVar34 = vpmovsxwd_avx2(auVar31._16_16_);
        auVar31 = vpmovsxwd_avx2(auVar20._0_16_);
        auVar31 = vpaddd_avx2(auVar33,auVar31);
        auVar20 = vpmovsxwd_avx2(auVar20._16_16_);
        auVar20 = vpaddd_avx2(auVar34,auVar20);
        auVar29 = vpaddd_avx2(auVar41,auVar29);
        auVar29 = vpsrad_avx2(auVar29,7);
        auVar31 = vpaddd_avx2(auVar41,auVar31);
        auVar31 = vpsrad_avx2(auVar31,7);
        auVar31 = vpackusdw_avx2(auVar29,auVar31);
        auVar25 = vpaddd_avx2(auVar41,auVar25);
        auVar25 = vpsrad_avx2(auVar25,7);
        auVar20 = vpaddd_avx2(auVar41,auVar20);
        auVar20 = vpsrad_avx2(auVar20,7);
        auVar20 = vpackusdw_avx2(auVar25,auVar20);
        auVar31 = vpackuswb_avx2(auVar31,auVar20);
        auVar39 = vpunpckldq_avx(auVar31._0_16_,auVar31._16_16_);
        *(undefined1 (*) [16])(intbuf + (lVar12 >> 0x20) + lVar17) = auVar39;
        auVar39 = vpunpckhdq_avx(auVar31._0_16_,auVar31._16_16_);
        *(undefined1 (*) [16])(intbuf + (lVar12 >> 0x20) + (uVar16 | 1) * lVar5) = auVar39;
        iVar4 = iVar4 + -0x20;
        lVar12 = lVar12 + 0x1000000000;
        iVar11 = 3;
        iVar8 = -3;
        bVar15 = false;
      } while (uVar14 <= filtered_length - 0x20);
      if (iVar4 < 0x10) {
LAB_00467051:
        iVar11 = 3;
        if (7 < iVar4) goto LAB_00467060;
LAB_00467168:
        if (iVar4 != 0) goto LAB_0046716c;
      }
      else {
        bVar15 = false;
LAB_00466ef1:
        if ((iVar4 != 0x12) && (iVar4 != 0x14)) {
          iVar7 = filtered_length - iVar4;
          iVar1 = iVar7 + iVar13 * in_stride;
          if (iVar7 + 0x10 == filtered_length) {
            iVar6 = 5;
          }
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(input + (long)((in_stride + iVar1 + 0x10) - iVar6) + -3);
          auVar19._8_8_ = 0;
          auVar19._0_8_ =
               *(ulong *)(input + (long)((iVar13 * in_stride + iVar7 + 0x10) - iVar6) + -3);
          auVar21._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar19;
          auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
          if (iVar7 + 0x10 == filtered_length) {
            auVar21 = vpshufb_avx2(auVar21,auVar36);
          }
          auVar26._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(input + (iVar8 + in_stride + iVar1)) +
               ZEXT116(1) * *(undefined1 (*) [16])(input + (iVar1 - iVar11));
          auVar26._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(input + (iVar8 + in_stride + iVar1));
          if (bVar15) {
            auVar26 = vpshufb_avx2(auVar26,auVar44);
          }
          iVar4 = iVar4 + -0x10;
          iVar11 = iVar13 * width2 + iVar7 / 2;
          auVar31 = vpalignr_avx2(auVar21,auVar26,2);
          auVar20 = vpalignr_avx2(auVar21,auVar26,4);
          auVar25 = vpalignr_avx2(auVar21,auVar26,6);
          auVar29 = vpmaddubsw_avx2(auVar26,_DAT_0056acc0);
          auVar31 = vpmaddubsw_avx2(auVar31,_DAT_0056ace0);
          auVar31 = vpaddw_avx2(auVar31,auVar29);
          auVar20 = vpmaddubsw_avx2(auVar20,_DAT_0056ad00);
          auVar25 = vpmaddubsw_avx2(auVar25,_DAT_0056ad20);
          auVar20 = vpaddw_avx2(auVar25,auVar20);
          auVar25 = vpmovsxwd_avx2(auVar31._0_16_);
          auVar29 = vpmovsxwd_avx2(auVar31._16_16_);
          auVar31 = vpmovsxwd_avx2(auVar20._0_16_);
          auVar31 = vpaddd_avx2(auVar25,auVar31);
          auVar20 = vpmovsxwd_avx2(auVar20._16_16_);
          auVar20 = vpaddd_avx2(auVar29,auVar20);
          auVar31 = vpaddd_avx2(auVar41,auVar31);
          auVar25 = vpsrad_avx2(auVar31,7);
          auVar31 = vpaddd_avx2(auVar41,auVar20);
          auVar31 = vpsrad_avx2(auVar31,7);
          auVar31 = vpackusdw_avx2(auVar25,auVar31);
          auVar31 = vpackuswb_avx2(auVar31,auVar31);
          auVar39 = vpunpckldq_avx(auVar31._0_16_,auVar31._16_16_);
          *(long *)(intbuf + iVar11) = auVar39._0_8_;
          uVar2 = vpextrq_avx(auVar39,1);
          *(undefined8 *)(intbuf + (iVar11 + width2)) = uVar2;
          goto LAB_00467051;
        }
LAB_00467060:
        if ((iVar4 != 10) && (iVar4 != 0xc)) {
          iVar8 = filtered_length - iVar4;
          iVar11 = (iVar13 * in_stride - iVar11) + iVar8;
          if (iVar8 + 8 == filtered_length) {
            iVar6 = 5;
          }
          auVar22._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(input + ((iVar11 + in_stride) - iVar6)) +
               ZEXT116(1) * *(undefined1 (*) [16])(input + (iVar11 - iVar6));
          auVar22._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(input + ((iVar11 + in_stride) - iVar6));
          if (iVar8 + 8 == filtered_length) {
            auVar22 = vpshufb_avx2(auVar22,_DAT_0056ad80);
          }
          iVar4 = iVar4 + -8;
          auVar20 = vpsrldq_avx2(auVar22,2);
          auVar25 = vpsrldq_avx2(auVar22,4);
          auVar29 = vpsrldq_avx2(auVar22,6);
          auVar31 = vpmaddubsw_avx2(auVar22,_DAT_0056acc0);
          auVar20 = vpmaddubsw_avx2(auVar20,_DAT_0056ace0);
          auVar31 = vpaddw_avx2(auVar20,auVar31);
          auVar20 = vpmaddubsw_avx2(auVar25,_DAT_0056ad00);
          auVar25 = vpmaddubsw_avx2(auVar29,_DAT_0056ad20);
          auVar20 = vpaddw_avx2(auVar25,auVar20);
          auVar25 = vpmovsxwd_avx2(auVar31._0_16_);
          auVar29 = vpmovsxwd_avx2(auVar20._0_16_);
          auVar25 = vpaddd_avx2(auVar29,auVar25);
          auVar39 = vpmovsxwd_avx(auVar31._16_16_);
          auVar42 = vpmovsxwd_avx(auVar20._16_16_);
          auVar39 = vpaddd_avx(auVar42,auVar39);
          auVar23._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar25._0_16_;
          auVar23._16_16_ = ZEXT116(0) * auVar25._16_16_ + ZEXT116(1) * auVar39;
          auVar31 = vpaddd_avx2(auVar41,auVar23);
          auVar31 = vpsrad_avx2(auVar31,7);
          auVar31 = vpackusdw_avx2(auVar31,auVar31);
          auVar31 = vpackuswb_avx2(auVar31,auVar31);
          *(int *)(intbuf + iVar8 / 2 + lVar17) = auVar31._0_4_;
          *(int *)(intbuf + lVar5 + iVar8 / 2 + lVar17) = auVar31._16_4_;
          goto LAB_00467168;
        }
LAB_0046716c:
        iVar4 = filtered_length - iVar4;
        down2_symeven(input + uVar16 * (long)in_stride,filtered_length,intbuf + iVar4 / 2 + lVar17,
                      iVar4);
        down2_symeven(input + uVar16 * (long)in_stride + in_stride,filtered_length,
                      intbuf + iVar4 / 2 + lVar17 + lVar5,iVar4);
      }
      uVar16 = uVar16 + 2;
      iVar3 = iVar3 + in_stride * 2;
      iVar9 = iVar9 + in_stride * 2;
      auVar44._16_16_ = _DAT_0056ada0;
      auVar44._0_16_ = _DAT_0056ada0;
      auVar36._16_16_ = _DAT_0056adb0;
      auVar36._0_16_ = _DAT_0056adb0;
    } while (uVar16 < (uint)height);
  }
  return;
}

Assistant:

void av1_resize_horz_dir_avx2(const uint8_t *const input, int in_stride,
                              uint8_t *intbuf, int height, int filtered_length,
                              int width2) {
  assert(height % 2 == 0);
  // Invoke SSE2 for width less than 32.
  if (filtered_length < 32) {
    av1_resize_horz_dir_sse2(input, in_stride, intbuf, height, filtered_length,
                             width2);
    return;
  }

  const int filt_length = sizeof(av1_down2_symeven_half_filter);
  assert(filt_length % 2 == 0);
  (void)filt_length;

  __m256i s0[4], s1[4], coeffs_x[4];

  const int bits = FILTER_BITS;
  const int dst_stride = width2;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);

  const uint8_t max_pixel = 255;
  const __m256i clip_pixel = _mm256_set1_epi8((char)max_pixel);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i wd32_start_pad_mask =
      _mm256_loadu_si256((__m256i *)wd32_left_padding_mask);
  const __m256i wd32_end_pad_mask =
      _mm256_loadu_si256((__m256i *)wd32_right_padding_mask);
  const __m256i wd8_end_pad_mask =
      _mm256_loadu_si256((__m256i *)wd8_right_padding_mask);
  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_x);

  // The core horizontal SIMD processes 32 input pixels of 2 rows simultaneously
  // to generate output corresponding to 2 rows. To streamline the core loop and
  // eliminate the need for conditional checks, the remaining columns (16 or 8)
  // are processed separately.
  if (filtered_length % 32 == 0) {
    for (int i = 0; i < height; i += 2) {
      int filter_offset = 0;
      int row_offset = 0;
      for (int j = 0; j < filtered_length; j += 32) {
        PROCESS_RESIZE_X_WD32
      }
    }
  } else {
    for (int i = 0; i < height; i += 2) {
      int filter_offset = 0;
      int remain_col = filtered_length;
      int row_offset = 0;
      // To avoid pixel over-read at frame boundary, processing of 32 pixels
      // is done using the core loop only if sufficient number of pixels
      // required for the load are present. The remaining pixels are processed
      // separately.
      for (int j = 0; j <= filtered_length - 32; j += 32) {
        if (remain_col == 34 || remain_col == 36) {
          break;
        }
        PROCESS_RESIZE_X_WD32
        remain_col -= 32;
      }

      int wd_processed = filtered_length - remain_col;
      // To avoid pixel over-read at frame boundary, processing of 16 pixels
      // is done only if sufficient number of pixels required for the
      // load are present. The remaining pixels are processed separately.
      if (remain_col > 15 && remain_col != 18 && remain_col != 20) {
        remain_col = filtered_length - wd_processed - 16;
        const int in_idx = i * in_stride + wd_processed;
        const int out_idx = (i * dst_stride) + wd_processed / 2;
        // a0 a1 --- a15
        __m128i row0 =
            _mm_loadu_si128((__m128i *)&input[in_idx - filter_offset]);
        // b0 b1 --- b15
        __m128i row1 = _mm_loadu_si128(
            (__m128i *)&input[in_idx + in_stride - filter_offset]);
        // a0 a1 --- a15 || b0 b1 --- b15
        __m256i r0 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);
        if (filter_offset == 0) {
          r0 = _mm256_shuffle_epi8(r0, wd32_start_pad_mask);
        }
        filter_offset = 3;
        const int is_last_cols16 = wd_processed + 16 == filtered_length;
        if (is_last_cols16) row_offset = ROW_OFFSET;

        // a16 a17 --- a23
        row0 = _mm_loadl_epi64(
            (__m128i *)&input[in_idx + 16 - row_offset - filter_offset]);
        // b16 b17 --- b23
        row1 = _mm_loadl_epi64((__m128i *)&input[in_idx + 16 + in_stride -
                                                 row_offset - filter_offset]);

        // a16-a23 x x x x| b16-b23 x x x x
        __m256i r1 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);

        // Pad end pixels to the right, while processing the last pixels in the
        // row.
        if (is_last_cols16) {
          r1 = _mm256_shuffle_epi8(_mm256_srli_si256(r1, ROW_OFFSET),
                                   wd32_end_pad_mask);
        }

        // a0 a1 --- a15 || b0 b1 --- b15
        s0[0] = r0;
        // a2 a3 --- a17 || b2 b3 --- b17
        s0[1] = _mm256_alignr_epi8(r1, r0, 2);
        // a4 a5 --- a19 || b4 b5 --- b19
        s0[2] = _mm256_alignr_epi8(r1, r0, 4);
        // a6 a7 --- a21 || b6 b7 --- b21
        s0[3] = _mm256_alignr_epi8(r1, r0, 6);

        // result for 16 pixels (a0 to a15) of row0 and row1
        __m256i res_out_0[2];
        res_out_0[0] = res_out_0[1] = zero;
        resize_convolve(s0, coeffs_x, res_out_0);

        // r00-r07
        res_out_0[0] = _mm256_sra_epi32(
            _mm256_add_epi32(res_out_0[0], round_const_bits), round_shift_bits);
        // r10-r17
        res_out_0[1] = _mm256_sra_epi32(
            _mm256_add_epi32(res_out_0[1], round_const_bits), round_shift_bits);
        // r00-r03 r10-r13 r04-r07 r14-r17
        __m256i res_out_row01 = _mm256_packus_epi32(res_out_0[0], res_out_0[1]);
        // r00-r03 r10-r13 r00-r03 r10-r13 | r04-r07 r14-r17 r04-r07 r14-r17
        res_out_row01 = _mm256_packus_epi16(res_out_row01, res_out_row01);
        res_out_row01 = _mm256_min_epu8(res_out_row01, clip_pixel);
        res_out_row01 = _mm256_max_epu8(res_out_row01, zero);
        // r00-r03 r10-r13 r04-r07 r14-r17
        __m128i low_result =
            CAST_LOW(_mm256_permute4x64_epi64(res_out_row01, 0xd8));
        // r00-r03 r04-r07 r10-r13 r14-r17
        low_result = _mm_shuffle_epi32(low_result, 0xd8);

        _mm_storel_epi64((__m128i *)&intbuf[out_idx], low_result);
        _mm_storel_epi64((__m128i *)&intbuf[out_idx + dst_stride],
                         _mm_unpackhi_epi64(low_result, low_result));
      }

      // To avoid pixel over-read at frame boundary, processing of 8 pixels
      // is done only if sufficient number of pixels required for the
      // load are present. The remaining pixels are processed by C function.
      wd_processed = filtered_length - remain_col;
      if (remain_col > 7 && remain_col != 10 && remain_col != 12) {
        remain_col = filtered_length - wd_processed - 8;
        const int in_idx = i * in_stride + wd_processed - filter_offset;
        const int out_idx = (i * dst_stride) + wd_processed / 2;
        const int is_last_cols_8 = wd_processed + 8 == filtered_length;
        if (is_last_cols_8) row_offset = ROW_OFFSET;
        // a0 a1 --- a15
        __m128i row0 = _mm_loadu_si128((__m128i *)&input[in_idx - row_offset]);
        // b0 b1 --- b15
        __m128i row1 =
            _mm_loadu_si128((__m128i *)&input[in_idx + in_stride - row_offset]);
        // a0 a1 --- a15 || b0 b1 --- b15
        __m256i r0 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);

        // Pad end pixels to the right, while processing the last pixels in the
        // row.
        if (is_last_cols_8)
          r0 = _mm256_shuffle_epi8(_mm256_srli_si256(r0, ROW_OFFSET),
                                   wd8_end_pad_mask);

        // a0 a1 a2 a3 a4 a5 a6 a7 | b0 b1 b2 b3 b4 b5 b6 b7
        s0[0] = r0;
        // a2 a3 a4 a5 a6 a7 a8 a9 | b2 b3 b4 b5 b6 b7 b8 b9
        s0[1] = _mm256_bsrli_epi128(r0, 2);
        // a4 a5 a6 a7 a8 a9 a10 a10 |  b4 b5 b6 b7 b8 b9 b10 b10
        s0[2] = _mm256_bsrli_epi128(r0, 4);
        // a6 a7 a8 a9 a10 a10 a10 a10 | b6 b7 b8 b9 b10 b10 b10 b10
        s0[3] = _mm256_bsrli_epi128(r0, 6);

        __m256i res_out_0[2];
        res_out_0[0] = res_out_0[1] = zero;
        resize_convolve(s0, coeffs_x, res_out_0);

        // r00 - r03 | r10 - r13
        __m256i res_out =
            _mm256_permute2x128_si256(res_out_0[0], res_out_0[1], 0x20);
        // r00 - r03 | r10 - r13
        res_out = _mm256_sra_epi32(_mm256_add_epi32(res_out, round_const_bits),
                                   round_shift_bits);
        // r00-r03 r00-r03 r10-r13 r10-r13
        __m256i res_out_row01 = _mm256_packus_epi32(res_out, res_out);
        // r00-r03 r00-r03 r00-r03 r00-r03 r10-r13 r10-r13 r10-r13 r10-r13
        res_out_row01 = _mm256_packus_epi16(res_out_row01, res_out_row01);
        res_out_row01 = _mm256_min_epu8(res_out_row01, clip_pixel);
        res_out_row01 = _mm256_max_epu8(res_out_row01, zero);

        xx_storel_32(intbuf + out_idx, CAST_LOW(res_out_row01));
        xx_storel_32(intbuf + out_idx + dst_stride,
                     _mm256_extracti128_si256(res_out_row01, 1));
      }

      wd_processed = filtered_length - remain_col;
      if (remain_col) {
        const int in_idx = (in_stride * i);
        const int out_idx = (wd_processed / 2) + width2 * i;

        down2_symeven(input + in_idx, filtered_length, intbuf + out_idx,
                      wd_processed);
        down2_symeven(input + in_idx + in_stride, filtered_length,
                      intbuf + out_idx + width2, wd_processed);
      }
    }
  }
}